

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall spirv_cross::Compiler::expression_type_id(Compiler *this,uint32_t id)

{
  Types TVar1;
  Variant *this_00;
  SPIRVariable *pSVar2;
  SPIRExpression *pSVar3;
  SPIRConstant *pSVar4;
  SPIRConstantOp *pSVar5;
  SPIRUndef *pSVar6;
  SPIRCombinedImageSampler *pSVar7;
  SPIRAccessChain *pSVar8;
  CompilerError *this_01;
  allocator local_41;
  string local_40 [36];
  uint32_t local_1c;
  Compiler *pCStack_18;
  uint32_t id_local;
  Compiler *this_local;
  
  local_1c = id;
  pCStack_18 = this;
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
  TVar1 = Variant::get_type(this_00);
  switch(TVar1) {
  case TypeVariable:
    pSVar2 = get<spirv_cross::SPIRVariable>(this,local_1c);
    this_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).field_0xc);
    break;
  case TypeConstant:
    pSVar4 = get<spirv_cross::SPIRConstant>(this,local_1c);
    this_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).field_0xc);
    break;
  default:
    this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,"Cannot resolve expression type.",&local_41);
    CompilerError::CompilerError(this_01,(string *)local_40);
    __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case TypeExpression:
    pSVar3 = get<spirv_cross::SPIRExpression>(this,local_1c);
    this_local._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->expression_type);
    break;
  case TypeConstantOp:
    pSVar5 = get<spirv_cross::SPIRConstantOp>(this,local_1c);
    this_local._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->basetype);
    break;
  case TypeCombinedImageSampler:
    pSVar7 = get<spirv_cross::SPIRCombinedImageSampler>(this,local_1c);
    this_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar7->super_IVariant).field_0xc);
    break;
  case TypeAccessChain:
    pSVar8 = get<spirv_cross::SPIRAccessChain>(this,local_1c);
    this_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar8->super_IVariant).field_0xc);
    break;
  case TypeUndef:
    pSVar6 = get<spirv_cross::SPIRUndef>(this,local_1c);
    this_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).field_0xc);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Compiler::expression_type_id(uint32_t id) const
{
	switch (ir.ids[id].get_type())
	{
	case TypeVariable:
		return get<SPIRVariable>(id).basetype;

	case TypeExpression:
		return get<SPIRExpression>(id).expression_type;

	case TypeConstant:
		return get<SPIRConstant>(id).constant_type;

	case TypeConstantOp:
		return get<SPIRConstantOp>(id).basetype;

	case TypeUndef:
		return get<SPIRUndef>(id).basetype;

	case TypeCombinedImageSampler:
		return get<SPIRCombinedImageSampler>(id).combined_type;

	case TypeAccessChain:
		return get<SPIRAccessChain>(id).basetype;

	default:
		SPIRV_CROSS_THROW("Cannot resolve expression type.");
	}
}